

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assignment.cpp
# Opt level: O0

array<double,_5UL> * testFilter(FilterType *filter)

{
  bool bVar1;
  reference pvVar2;
  double in_RSI;
  array<double,_5UL> *in_RDI;
  array<double,_5UL> *this;
  CascadeStages<4,_Iir::DirectFormII> *unaff_retaddr;
  size_t i;
  bool first;
  size_type in_stack_ffffffffffffffc8;
  ulong local_18;
  
  std::operator<<((ostream *)&std::cout,"Test response: [");
  bVar1 = true;
  for (local_18 = 0; local_18 < 5; local_18 = local_18 + 1) {
    if (!bVar1) {
      std::operator<<((ostream *)&std::cout,", ");
    }
    bVar1 = false;
    this = (array<double,_5UL> *)
           Iir::CascadeStages<4,_Iir::DirectFormII>::filter<double>(unaff_retaddr,in_RSI);
    pvVar2 = std::array<double,_5UL>::operator[](this,in_stack_ffffffffffffffc8);
    *pvVar2 = (value_type)this;
    pvVar2 = std::array<double,_5UL>::operator[](this,in_stack_ffffffffffffffc8);
    std::ostream::operator<<((ostream *)&std::cout,*pvVar2);
  }
  std::operator<<((ostream *)&std::cout,"]\n");
  return in_RDI;
}

Assistant:

std::array<double, test_len> testFilter(FilterType& filter) {
    std::array <double, test_len> result;
    std::cout << "Test response: [";
    bool first {true};
    for (size_t i = 0; i < test_len; ++i) {
        if (!first) std::cout << ", ";
        first = false;
        result[i] = filter.filter(1.0);
        std::cout << result[i];
    }
    std::cout << "]\n";
    return result;
}